

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O2

void __thiscall
FPCXTexture::ReadPCX24bits(FPCXTexture *this,BYTE *dst,FileReader *lump,PCXHeader *hdr,int planes)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  int iVar7;
  BYTE *pBVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  bool bVar12;
  
  uVar9 = lump->Length - 0x80;
  pbVar1 = (byte *)operator_new__(uVar9);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,pbVar1,uVar9);
  iVar2 = 0;
  uVar9 = 0;
  if (0 < planes) {
    uVar9 = (ulong)(uint)planes;
  }
  bVar6 = 0;
  iVar7 = 0;
  pbVar5 = pbVar1;
  for (uVar4 = 0; uVar4 < (this->super_FTexture).Height; uVar4 = uVar4 + 1) {
    pBVar8 = dst;
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      uVar3 = (uint)hdr->bytesPerScanLine;
      pbVar11 = pBVar8 + (int)((uint)(this->super_FTexture).Width * iVar2);
      while (bVar12 = uVar3 != 0, uVar3 = uVar3 - 1, bVar12) {
        if (iVar7 == 0) {
          bVar6 = *pbVar5;
          if (bVar6 < 0xc0) {
            pbVar5 = pbVar5 + 1;
            iVar7 = 1;
          }
          else {
            iVar7 = bVar6 - 0xc0;
            bVar6 = pbVar5[1];
            pbVar5 = pbVar5 + 2;
          }
        }
        iVar7 = iVar7 + -1;
        *pbVar11 = bVar6;
        pbVar11 = pbVar11 + planes;
      }
      pBVar8 = pBVar8 + 1;
    }
    iVar2 = iVar2 + planes;
  }
  operator_delete__(pbVar1);
  return;
}

Assistant:

void FPCXTexture::ReadPCX24bits (BYTE *dst, FileReader & lump, PCXHeader *hdr, int planes)
{
	int rle_count = 0, rle_value = 0;
	int y, c;
	int bytes;

	BYTE * srcp = new BYTE[lump.GetLength() - sizeof(PCXHeader)];
	lump.Read(srcp, lump.GetLength() - sizeof(PCXHeader));
	BYTE * src = srcp;

	for (y = 0; y < Height; ++y)
	{
		/* for each color plane */
		for (c = 0; c < planes; ++c)
		{
			BYTE * ptr = &dst[y * Width * planes];
			bytes = hdr->bytesPerScanLine;

			while (bytes--)
			{
				if (rle_count == 0)
				{
					if( (rle_value = *src++) < 0xc0)
					{
						rle_count = 1;
					}
					else
					{
						rle_count = rle_value - 0xc0;
						rle_value = *src++;
					}
				}

				rle_count--;
				ptr[c] = (BYTE)rle_value;
				ptr += planes;
			}
		}
	}
	delete [] srcp;
}